

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O1

void __thiscall Apt::AddStartupLoc(Apt *this,string *_id,double _lat,double _lon,double _heading)

{
  pointer pSVar1;
  ptTy pVar2;
  positionTy startPos;
  double local_138;
  double local_130;
  vectorTy local_128;
  positionTy local_108;
  positionTy local_b8;
  positionTy local_70;
  
  if (_heading < 0.0) {
    do {
      _heading = _heading + 360.0;
    } while (_heading < 0.0);
  }
  if (((_lon < 180.0) && (ABS(_lat) <= 90.0)) && (-180.0 <= _lon)) {
    local_70._alt = NAN;
    local_70._ts = NAN;
    local_70._head = NAN;
    local_70._pitch = NAN;
    local_70._roll = NAN;
    local_70.mergeCount = 1;
    local_70.f = (posFlagsTy)((ushort)local_70.f & 0x8000);
    local_70.edgeIdx = 0xffffffffffffffff;
    local_138 = _heading;
    local_70._lat = _lat;
    local_70._lon = _lon;
    local_128.angle = fmod(_heading + 180.0,360.0);
    local_128.dist = 10.0;
    local_128.vsi = NAN;
    local_128.speed = NAN;
    CoordPlusVector(&local_b8,&local_70,&local_128);
    local_108._lat = local_b8._lat;
    local_130 = local_b8._lon;
    std::vector<StartupLoc,std::allocator<StartupLoc>>::
    emplace_back<std::__cxx11::string_const&,double,double,double&>
              ((vector<StartupLoc,std::allocator<StartupLoc>> *)&this->vecStartupLocs,_id,
               &local_108._lat,&local_130,&local_138);
    pSVar1 = (this->vecStartupLocs).super__Vector_base<StartupLoc,_std::allocator<StartupLoc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    boundingBoxTy::enlarge_pos
              (&this->bounds,pSVar1[-1].super_TaxiNode.lat,pSVar1[-1].super_TaxiNode.lon);
    local_128.dist = 50.0;
    CoordPlusVector(&local_108,&local_b8,&local_128);
    pVar2.y._0_4_ = SUB84(local_108._lat,0);
    pVar2.x = local_108._lon;
    pVar2.y._4_4_ = (int)((ulong)local_108._lat >> 0x20);
    pSVar1[-1].viaPos = pVar2;
  }
  return;
}

Assistant:

void AddStartupLoc (const std::string& _id,
                        double _lat, double _lon,
                        double _heading)
    {
        // Heading could be defined negative
        while (_heading < 0.0)
            _heading += 360.0;

        // resonabilit check...then add to our list of startup locations
        if ( -90.0 <= _lat && _lat <= 90.0 &&
            -180.0 <= _lon && _lon < 180.0)
        {
            // The startup location seems to be aligned with the plane's tip
            // while all CSL model's origin is at the center of the full.
            // To (partly) make up for this we move out the startup location
            // by about 10m. (`viaPos` is here just used as temp variable.)
            const positionTy origPos (_lat, _lon);
            vectorTy vec (std::fmod(_heading+180.0, 360.0),
                          APT_STARTUP_MOVE_BACK);
            const positionTy startPos = CoordPlusVector(origPos, vec);

            // now add this moved out position to our list
            vecStartupLocs.emplace_back(_id, startPos.lat(), startPos.lon(), _heading);
            StartupLoc& loc = vecStartupLocs.back();
            bounds.enlarge_pos(loc.lat, loc.lon);       // make sure it becomes part of the airport boundary
            
            // Add another position 50m out as the "via" pos: via which we roll to the startup location
            vec.dist = APT_STARTUP_VIA_DIST;
            loc.viaPos = CoordPlusVector(startPos, vec);
        }
    }